

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FieldSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,uint *args_2,uint *args_3)

{
  string_view name;
  FieldSymbol *pFVar1;
  uint64_t in_RCX;
  FieldSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  BumpAllocator *in_R8;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pFVar1 = (FieldSymbol *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::FieldSymbol::FieldSymbol(in_RDX,name,in_RSI,in_RCX,(uint32_t)((ulong)in_R8 >> 0x20));
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }